

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

uint32_t __thiscall icu_63::CollationData::getFinalCE32(CollationData *this,uint32_t ce32)

{
  UBool UVar1;
  undefined4 local_14;
  uint32_t ce32_local;
  CollationData *this_local;
  
  UVar1 = Collation::isSpecialCE32(ce32);
  local_14 = ce32;
  if (UVar1 != '\0') {
    local_14 = getIndirectCE32(this,ce32);
  }
  return local_14;
}

Assistant:

uint32_t
CollationData::getFinalCE32(uint32_t ce32) const {
    if(Collation::isSpecialCE32(ce32)) {
        ce32 = getIndirectCE32(ce32);
    }
    return ce32;
}